

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderBarrier3::verifyXFBBuffer(TessellationShaderBarrier3 *this,void *data)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  reference pvVar4;
  ostream *poVar5;
  TestLog *this_00;
  MessageBuilder *this_01;
  TestError *this_02;
  string local_3d8 [32];
  char *local_3b8;
  MessageBuilder local_3b0;
  uint local_230;
  uint local_22c;
  uint n_patch_vertex_2;
  uint n_patch_vertex_1;
  stringstream logMessage;
  ostream local_218;
  uint local_9c;
  pointer piStack_98;
  uint n_invocation;
  int *patch_data_int;
  byte local_85;
  int n_points_per_line_segment;
  uint uStack_80;
  bool are_equal;
  uint n_patch;
  uint invocation_id;
  uint n_patch_vertex;
  uint n_1;
  uint n;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> tcs_patch_result;
  allocator<int> local_3d;
  value_type_conflict1 local_3c;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> tcs_data;
  int *data_int;
  void *data_local;
  TessellationShaderBarrier3 *this_local;
  
  uVar1 = this->m_n_invocations;
  local_3c = 0;
  tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)data;
  std::allocator<int>::allocator(&local_3d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,(ulong)uVar1,&local_3c,&local_3d);
  std::allocator<int>::~allocator(&local_3d);
  uVar1 = this->m_n_invocations;
  n = 0;
  std::allocator<int>::allocator((allocator<int> *)((long)&n_1 + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(ulong)uVar1,(value_type_conflict1 *)&n,
             (allocator<int> *)((long)&n_1 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&n_1 + 3));
  for (n_patch_vertex = 0; uVar1 = n_patch_vertex, n_patch_vertex < this->m_n_invocations;
      n_patch_vertex = n_patch_vertex + 2) {
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_38,(ulong)n_patch_vertex)
    ;
    *puVar3 = uVar1;
  }
  for (invocation_id = 1; invocation_id < this->m_n_invocations; invocation_id = invocation_id + 2)
  {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(ulong)(invocation_id - 1));
    iVar2 = *pvVar4 + invocation_id;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(ulong)invocation_id);
    *pvVar4 = iVar2;
  }
  for (n_patch = 0; n_patch < this->m_n_invocations; n_patch = n_patch + 1) {
    uStack_80 = n_patch;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_68,(ulong)n_patch);
    *pvVar4 = 0;
    if ((uStack_80 & 3) == 0) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,(ulong)uStack_80);
      iVar2 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,(ulong)uStack_80);
      *pvVar4 = iVar2 + *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,(ulong)(uStack_80 + 1));
      iVar2 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,(ulong)uStack_80);
      *pvVar4 = iVar2 + *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,(ulong)(uStack_80 + 2));
      iVar2 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,(ulong)uStack_80);
      *pvVar4 = iVar2 + *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,(ulong)(uStack_80 + 3));
      iVar2 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,(ulong)uStack_80);
      *pvVar4 = iVar2 + *pvVar4;
    }
  }
  n_points_per_line_segment = 0;
  do {
    if (this->m_n_result_vertices / this->m_n_invocations <= (uint)n_points_per_line_segment) {
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68)
      ;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38)
      ;
      return true;
    }
    local_85 = 1;
    patch_data_int._4_4_ = 2;
    piStack_98 = tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage +
                 n_points_per_line_segment * this->m_n_invocations * 2;
    for (local_9c = 0; local_9c < this->m_n_invocations; local_9c = local_9c + 1) {
      iVar2 = piStack_98[local_9c];
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,(ulong)local_9c);
      if (iVar2 != *pvVar4) {
        local_85 = 0;
        break;
      }
    }
    if ((local_85 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&n_patch_vertex_2);
      poVar5 = std::operator<<(&local_218,"Result data for patch [");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,n_points_per_line_segment);
      std::operator<<(poVar5,"]: (");
      for (local_22c = 0; local_22c < this->m_n_patch_vertices; local_22c = local_22c + 1) {
        std::ostream::operator<<(&local_218,piStack_98[local_22c]);
        if (local_22c == this->m_n_patch_vertices - 1) {
          std::operator<<(&local_218,"), ");
        }
        else {
          std::operator<<(&local_218,", ");
        }
      }
      std::operator<<(&local_218,"expected: ");
      for (local_230 = 0; local_230 < this->m_n_patch_vertices; local_230 = local_230 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_68,(ulong)local_230);
        std::ostream::operator<<(&local_218,*pvVar4);
        if (local_230 == this->m_n_patch_vertices - 1) {
          std::operator<<(&local_218,"). ");
        }
        else {
          std::operator<<(&local_218,", ");
        }
      }
      this_00 = tcu::TestContext::getLog
                          ((this->super_TessellationShaderBarrierTestCase).super_TestCaseBase.
                           super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      std::__cxx11::stringstream::str();
      local_3b8 = (char *)std::__cxx11::string::c_str();
      this_01 = tcu::MessageBuilder::operator<<(&local_3b0,&local_3b8);
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string(local_3d8);
      tcu::MessageBuilder::~MessageBuilder(&local_3b0);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Invalid data captured",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                 ,0x3d8);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    n_points_per_line_segment = n_points_per_line_segment + 1;
  } while( true );
}

Assistant:

bool TessellationShaderBarrier3::verifyXFBBuffer(const void* data)
{
	const int*		 data_int = (const int*)data;
	std::vector<int> tcs_data(m_n_invocations, 0);
	std::vector<int> tcs_patch_result(m_n_invocations, 0);

	/* This is a simple C++ port of the TCS used for the test.
	 *
	 * Note: We only need to consider a single set of values stored by TES
	 *       for a single result point, as the same set of values will be
	 *       reported for the other point. Owing to the fact gl_InvocationID
	 *       in TCS will iterate from 0 to 15 for all input patches and instances,
	 *       we can re-use the data for all subsequent input patches. */
	/* Phase 1 */
	for (unsigned int n = 0; n < m_n_invocations; n += 2)
	{
		tcs_data[n] = n;
	}

	/* Phase 2 */
	for (unsigned int n = 1; n < m_n_invocations; n += 2)
	{
		tcs_data[n] = tcs_data[n - 1] + n;
	}

	/* Phase 3 */
	for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_invocations; ++n_patch_vertex)
	{
		const unsigned int invocation_id = n_patch_vertex;

		tcs_patch_result[invocation_id] = 0;

		if ((invocation_id % 4) == 0)
		{
			tcs_patch_result[invocation_id] += tcs_data[invocation_id];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 1];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 2];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 3];
		}
	} /* for (all patch vertices) */

	/* Time to do the actual comparison. */
	for (unsigned int n_patch = 0; n_patch < m_n_result_vertices / m_n_invocations; ++n_patch)
	{
		bool	   are_equal				 = true;
		const int  n_points_per_line_segment = 2;
		const int* patch_data_int			 = data_int + n_patch * m_n_invocations * n_points_per_line_segment;

		for (unsigned int n_invocation = 0; n_invocation < m_n_invocations; ++n_invocation)
		{
			if (patch_data_int[n_invocation] != tcs_patch_result[n_invocation])
			{
				are_equal = false;

				break;
			}
		} /* for (all patch vertices which have contributed for given input patch being considered) */

		if (!are_equal)
		{
			std::stringstream logMessage;

			logMessage << "Result data for patch [" << n_patch << "]: (";

			for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_patch_vertices; ++n_patch_vertex)
			{
				logMessage << patch_data_int[n_patch_vertex];

				if (n_patch_vertex == (m_n_patch_vertices - 1))
				{
					logMessage << "), ";
				}
				else
				{
					logMessage << ", ";
				}
			} /* for (all patch vertices) */

			logMessage << "expected: ";

			for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_patch_vertices; ++n_patch_vertex)
			{
				logMessage << tcs_patch_result[n_patch_vertex];

				if (n_patch_vertex == (m_n_patch_vertices - 1))
				{
					logMessage << "). ";
				}
				else
				{
					logMessage << ", ";
				}
			} /* for (all patch vertices) */

			/* Log the message */
			m_testCtx.getLog() << tcu::TestLog::Message << logMessage.str().c_str() << tcu::TestLog::EndMessage;

			/* Bail out */
			TCU_FAIL("Invalid data captured");
		} /* if (!are_equal) */
	}	 /* for (all patches) */

	return true;
}